

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void __thiscall TestRunner::RunAll(TestRunner *this,TestCase **array,int numTests)

{
  bool bVar1;
  ulong uVar2;
  
  if (0 < numTests) {
    uVar2 = 0;
    do {
      bVar1 = TestCase::Start(array[uVar2]);
      if (!bVar1) {
        exit(1);
      }
      if (array[uVar2] != (TestCase *)0x0) {
        (*array[uVar2]->_vptr_TestCase[1])();
      }
      uVar2 = uVar2 + 1;
    } while ((uint)numTests != uVar2);
  }
  return;
}

Assistant:

void RunAll( TestCase **array, int numTests )
	{
		for( int i = 0; i < numTests; i++ )
		{
			LOG_NOTICE( "Running test %s", array[ i ]->GetTestName() );
			if ( array[ i ]->Start() == false )
			{
				exit( EXIT_FAILURE );
			}
			delete array[ i ];
		}
	}